

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Transcript::Transcript(Transcript *this,string *name,int length)

{
  int stop;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_108;
  Mask local_d0;
  int local_1c;
  string *psStack_18;
  int length_local;
  string *name_local;
  Transcript *this_local;
  
  local_1c = length;
  psStack_18 = name;
  name_local = (string *)this;
  Polymer::Polymer(&this->super_Polymer,name,1,length);
  (this->super_Polymer)._vptr_Polymer = (_func_int **)&PTR_Initialize_002aa5e8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  ::map(&this->bindings_);
  std::__cxx11::string::string((string *)&this->seq_);
  std::vector<double,_std::allocator<double>_>::vector(&this->weights_);
  (this->super_Polymer).attached_ = false;
  stop = (this->super_Polymer).stop_;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_108._M_t._M_impl._0_8_ = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&local_108);
  Mask::Mask(&local_d0,stop + 1,stop,&local_108);
  Mask::operator=(&(this->super_Polymer).mask_,&local_d0);
  Mask::~Mask(&local_d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map(&local_108);
  return;
}

Assistant:

Transcript::Transcript(const std::string &name, int length)
    : Polymer(name, 1, length) {
  attached_ = false;
  mask_ = Mask(stop_ + 1, stop_, std::map<std::string, double>());
}